

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.h
# Opt level: O1

unsigned_long axl::cry::failWithLastCryptoError<unsigned_long>(unsigned_long failResult)

{
  ulong code;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  code = ERR_peek_last_error();
  CryptoError::CryptoError((CryptoError *)&BStack_28,code);
  err::setError((ErrorRef *)&BStack_28);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&BStack_28);
  return failResult;
}

Assistant:

T
failWithLastCryptoError(T failResult) {
	setLastCryptoError();
	return failResult;
}